

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

void Abc_FrameReplacePoEquivs(Abc_Frame_t *pAbc,Vec_Ptr_t **pvPoEquivs)

{
  Vec_Ptr_t **pvPoEquivs_local;
  Abc_Frame_t *pAbc_local;
  
  if (pAbc->vPoEquivs != (Vec_Ptr_t *)0x0) {
    Vec_VecFree((Vec_Vec_t *)pAbc->vPoEquivs);
  }
  pAbc->vPoEquivs = *pvPoEquivs;
  *pvPoEquivs = (Vec_Ptr_t *)0x0;
  return;
}

Assistant:

void Abc_FrameReplacePoEquivs( Abc_Frame_t * pAbc, Vec_Ptr_t ** pvPoEquivs )
{
    if ( pAbc->vPoEquivs )
        Vec_VecFree( (Vec_Vec_t *)pAbc->vPoEquivs );
    pAbc->vPoEquivs = *pvPoEquivs;
    *pvPoEquivs = NULL;
}